

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprSynonymAdvanceto(Fts5ExprTerm *pTerm,int bDesc,i64 *piLast,int *pRc)

{
  long lVar1;
  i64 iVar2;
  i64 iRowid;
  Fts5ExprTerm *pFStack_40;
  int bEof;
  Fts5ExprTerm *p;
  i64 iLast;
  int *piStack_28;
  int rc;
  int *pRc_local;
  i64 *piLast_local;
  Fts5ExprTerm *pFStack_10;
  int bDesc_local;
  Fts5ExprTerm *pTerm_local;
  
  iLast._4_4_ = 0;
  p = (Fts5ExprTerm *)*piLast;
  iRowid._4_4_ = 0;
  piStack_28 = pRc;
  pRc_local = (int *)piLast;
  piLast_local._4_4_ = bDesc;
  pFStack_10 = pTerm;
  for (pFStack_40 = pTerm; iLast._4_4_ == 0 && pFStack_40 != (Fts5ExprTerm *)0x0;
      pFStack_40 = pFStack_40->pSynonym) {
    if ((pFStack_40->pIter->bEof == '\0') &&
       (((lVar1 = pFStack_40->pIter->iRowid, piLast_local._4_4_ == 0 && (lVar1 < (long)p)) ||
        ((piLast_local._4_4_ != 0 && ((long)p < lVar1)))))) {
      iLast._4_4_ = sqlite3Fts5IterNextFrom(pFStack_40->pIter,(i64)p);
    }
  }
  if (iLast._4_4_ == 0) {
    iVar2 = fts5ExprSynonymRowid(pFStack_10,piLast_local._4_4_,(int *)((long)&iRowid + 4));
    *(i64 *)pRc_local = iVar2;
  }
  else {
    *piStack_28 = iLast._4_4_;
    iRowid._4_4_ = 1;
  }
  return iRowid._4_4_;
}

Assistant:

static int fts5ExprSynonymAdvanceto(
  Fts5ExprTerm *pTerm,            /* Term iterator to advance */
  int bDesc,                      /* True if iterator is "rowid DESC" */
  i64 *piLast,                    /* IN/OUT: Lastest rowid seen so far */
  int *pRc                        /* OUT: Error code */
){
  int rc = SQLITE_OK;
  i64 iLast = *piLast;
  Fts5ExprTerm *p;
  int bEof = 0;

  for(p=pTerm; rc==SQLITE_OK && p; p=p->pSynonym){
    if( sqlite3Fts5IterEof(p->pIter)==0 ){
      i64 iRowid = p->pIter->iRowid;
      if( (bDesc==0 && iLast>iRowid) || (bDesc && iLast<iRowid) ){
        rc = sqlite3Fts5IterNextFrom(p->pIter, iLast);
      }
    }
  }

  if( rc!=SQLITE_OK ){
    *pRc = rc;
    bEof = 1;
  }else{
    *piLast = fts5ExprSynonymRowid(pTerm, bDesc, &bEof);
  }
  return bEof;
}